

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzer.cpp
# Opt level: O0

void fuzzBytes(BuilderContext *ctx)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  uchar uVar4;
  result_type_conflict rVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  uchar *puVar6;
  size_t bytePos;
  string vpackBytes;
  Buffer<unsigned_char> *builderBuffer;
  FuzzBytes fuzzByte;
  FuzzActions fuzzAction;
  uint32_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_ffffffffffffff50;
  Buffer<unsigned_char> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  uchar in_stack_ffffffffffffff6f;
  Buffer<unsigned_char> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *local_20;
  int local_14;
  int local_10;
  uint local_c;
  
  local_c = 0;
  do {
    if (9 < local_c) {
      return;
    }
    rVar5 = std::
            mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            ::operator()(in_stack_ffffffffffffff50);
    this_00 = (Buffer<unsigned_char> *)0xaaaaaaaaaaaaaaab;
    local_10 = (int)rVar5 + (int)(rVar5 / 3) * -3;
    rVar5 = std::
            mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            ::operator()(in_stack_ffffffffffffff50);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = rVar5;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = this_00;
    local_14 = (int)rVar5 + (int)(SUB168(auVar1 * auVar2,8) >> 1) * -3;
    local_20 = (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                *)arangodb::velocypack::Builder::bufferRef((Builder *)in_stack_ffffffffffffff50);
    arangodb::velocypack::Buffer<unsigned_char>::toString_abi_cxx11_(this_00);
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           getBytePos((BuilderContext *)
                      CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                      (FuzzBytes *)in_stack_ffffffffffffff60,(string *)in_stack_ffffffffffffff58);
    if (local_10 == 0) {
      bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x106e3c);
      if (!bVar3) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  (in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58,
                   (size_type)in_stack_ffffffffffffff50);
        goto LAB_00106f17;
      }
    }
    else {
      if (local_10 == 1) {
        bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x106e74)
        ;
        if (bVar3) goto LAB_00106f69;
        uVar4 = generateRandWithinRange<unsigned_char>
                          ((uchar)((ulong)in_stack_ffffffffffffff50 >> 0x38),
                           (uchar)((ulong)in_stack_ffffffffffffff50 >> 0x30),
                           (RandomGenerator *)in_stack_ffffffffffffff48);
        puVar6 = (uchar *)std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_ffffffffffffff50,
                                     (size_type)in_stack_ffffffffffffff48);
        *puVar6 = uVar4;
      }
      else if (local_10 == 2) {
        in_stack_ffffffffffffff6f =
             generateRandWithinRange<unsigned_char>
                       ((uchar)((ulong)in_stack_ffffffffffffff50 >> 0x38),
                        (uchar)((ulong)in_stack_ffffffffffffff50 >> 0x30),
                        (RandomGenerator *)in_stack_ffffffffffffff48);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                  (this,(size_type)in_stack_ffffffffffffff58,(size_type)in_stack_ffffffffffffff50,
                   (char)((ulong)in_stack_ffffffffffffff48 >> 0x38));
        in_stack_ffffffffffffff60 = this;
      }
LAB_00106f17:
      arangodb::velocypack::Buffer<unsigned_char>::clear
                ((Buffer<unsigned_char> *)in_stack_ffffffffffffff50);
      in_stack_ffffffffffffff48 = &local_40;
      in_stack_ffffffffffffff50 = local_20;
      in_stack_ffffffffffffff58 =
           (Buffer<unsigned_char> *)
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x106f3f)
      ;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                (in_stack_ffffffffffffff48);
      arangodb::velocypack::Buffer<unsigned_char>::append<unsigned_char>
                (in_stack_ffffffffffffff58,(uchar *)in_stack_ffffffffffffff50,
                 (ValueLength)in_stack_ffffffffffffff48);
    }
LAB_00106f69:
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff50);
    local_c = local_c + 1;
  } while( true );
}

Assistant:

static void fuzzBytes(BuilderContext& ctx) {
  using limits = KnownLimitValues;
  for (uint32_t i = 0; i < limits::numFuzzIterations; ++i) {
    FuzzActions fuzzAction = static_cast<FuzzActions>(
        ctx.randomGenerator.mt64() % FuzzActions::NUM_OPTIONS_ACTIONS);
    FuzzBytes fuzzByte = static_cast<FuzzBytes>(ctx.randomGenerator.mt64() %
                                                FuzzBytes::NUM_OPTIONS_BYTES);
    auto& builderBuffer = ctx.builder.bufferRef();
    std::string vpackBytes = builderBuffer.toString();
    size_t bytePos = getBytePos(ctx, fuzzByte, vpackBytes);
    switch (fuzzAction) {
      case REMOVE_BYTE:
        if (vpackBytes.empty()) {
          continue;
        }
        vpackBytes.erase(bytePos, 1);
        break;
      case REPLACE_BYTE:
        if (vpackBytes.empty()) {
          continue;
        }
        vpackBytes[bytePos] =
            generateRandWithinRange<uint8_t>(0, 255, ctx.randomGenerator);
        break;
      case INSERT_BYTE:
        vpackBytes.insert(
            bytePos, 1,
            static_cast<std::string::value_type>(
                generateRandWithinRange<uint8_t>(0, 255, ctx.randomGenerator)));
        break;
      default:
        VELOCYPACK_ASSERT(false);
    }
    builderBuffer.clear();
    builderBuffer.append(reinterpret_cast<uint8_t const*>(vpackBytes.data()),
                         vpackBytes.size());
  }
}